

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

ON_3fPoint * __thiscall ON_3fPoint::operator=(ON_3fPoint *this,double *p)

{
  undefined8 uVar1;
  float fVar2;
  
  if (p == (double *)0x0) {
    uVar1 = 0;
    fVar2 = 0.0;
  }
  else {
    uVar1 = CONCAT44((float)p[1],(float)*p);
    fVar2 = (float)p[2];
  }
  this->z = fVar2;
  this->x = (float)(int)uVar1;
  this->y = (float)(int)((ulong)uVar1 >> 0x20);
  return this;
}

Assistant:

ON_3fPoint& ON_3fPoint::operator=(const double* p)
{
  if ( p ) {
    x = (float)p[0];
    y = (float)p[1];
    z = (float)p[2];
  }
  else {
    x = y = z = 0.0;
  }
  return *this;
}